

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O0

void bson_copy_to(bson_t *src,bson_t *dst)

{
  uint8_t *__src;
  size_t num_bytes;
  void *pvVar1;
  size_t len;
  bson_impl_alloc_t *adst;
  uint8_t *data;
  bson_t *dst_local;
  bson_t *src_local;
  
  if (src == (bson_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
            0x876,"bson_copy_to","src");
    abort();
  }
  if (dst == (bson_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
            0x877,"bson_copy_to","dst");
    abort();
  }
  if ((src->flags & 1) == 0) {
    __src = _bson_data(src);
    num_bytes = bson_next_power_of_two((ulong)src->len);
    dst->flags = 2;
    dst->len = src->len;
    dst->padding[0] = '\0';
    dst->padding[1] = '\0';
    dst->padding[2] = '\0';
    dst->padding[3] = '\0';
    dst->padding[4] = '\0';
    dst->padding[5] = '\0';
    dst->padding[6] = '\0';
    dst->padding[7] = '\0';
    dst->padding[8] = '\0';
    dst->padding[9] = '\0';
    dst->padding[10] = '\0';
    dst->padding[0xb] = '\0';
    *(uint8_t **)(dst->padding + 0x10) = dst->padding + 0x28;
    *(uint8_t **)(dst->padding + 0x18) = dst->padding + 0x30;
    dst->padding[0x20] = '\0';
    dst->padding[0x21] = '\0';
    dst->padding[0x22] = '\0';
    dst->padding[0x23] = '\0';
    dst->padding[0x24] = '\0';
    dst->padding[0x25] = '\0';
    dst->padding[0x26] = '\0';
    dst->padding[0x27] = '\0';
    pvVar1 = bson_malloc(num_bytes);
    *(void **)(dst->padding + 0x28) = pvVar1;
    *(size_t *)(dst->padding + 0x30) = num_bytes;
    *(code **)(dst->padding + 0x38) = bson_realloc_ctx;
    dst->padding[0x40] = '\0';
    dst->padding[0x41] = '\0';
    dst->padding[0x42] = '\0';
    dst->padding[0x43] = '\0';
    dst->padding[0x44] = '\0';
    dst->padding[0x45] = '\0';
    dst->padding[0x46] = '\0';
    dst->padding[0x47] = '\0';
    memcpy(*(void **)(dst->padding + 0x28),__src,(ulong)src->len);
  }
  else {
    memcpy(dst,src,0x80);
    dst->flags = 3;
  }
  return;
}

Assistant:

void
bson_copy_to (const bson_t *src, bson_t *dst)
{
   const uint8_t *data;
   bson_impl_alloc_t *adst;
   size_t len;

   BSON_ASSERT (src);
   BSON_ASSERT (dst);

   if ((src->flags & BSON_FLAG_INLINE)) {
      memcpy (dst, src, sizeof *dst);
      dst->flags = (BSON_FLAG_STATIC | BSON_FLAG_INLINE);
      return;
   }

   data = _bson_data (src);
   len = bson_next_power_of_two ((size_t) src->len);

   adst = (bson_impl_alloc_t *) dst;
   adst->flags = BSON_FLAG_STATIC;
   adst->len = src->len;
   adst->parent = NULL;
   adst->depth = 0;
   adst->buf = &adst->alloc;
   adst->buflen = &adst->alloclen;
   adst->offset = 0;
   adst->alloc = bson_malloc (len);
   adst->alloclen = len;
   adst->realloc = bson_realloc_ctx;
   adst->realloc_func_ctx = NULL;
   memcpy (adst->alloc, data, src->len);
}